

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int reparse_equality_expr(lyxp_expr *exp,uint16_t *exp_idx)

{
  ushort repeat_op_idx;
  int iVar1;
  uint16_t uVar2;
  uint16_t exp_idx_00;
  
  exp_idx_00 = *exp_idx;
  while( true ) {
    iVar1 = reparse_additive_expr(exp,exp_idx);
    uVar2 = exp_idx_00;
    if (iVar1 != 0) {
      return -1;
    }
    while( true ) {
      repeat_op_idx = *exp_idx;
      if (exp->used == repeat_op_idx) {
        return 0;
      }
      if ((exp->tokens[repeat_op_idx] != LYXP_TOKEN_OPERATOR_COMP) ||
         ((byte)(exp->expr[exp->expr_pos[repeat_op_idx]] | 2U) != 0x3e)) break;
      exp_repeat_push(exp,uVar2,repeat_op_idx);
      uVar2 = *exp_idx;
      *exp_idx = uVar2 + 1;
      iVar1 = reparse_additive_expr(exp,exp_idx);
      uVar2 = uVar2 + 1;
      if (iVar1 != 0) {
        return -1;
      }
    }
    if (exp->used == repeat_op_idx) {
      return 0;
    }
    if (exp->tokens[repeat_op_idx] != LYXP_TOKEN_OPERATOR_COMP) break;
    if ((exp->expr[exp->expr_pos[repeat_op_idx]] != '=') &&
       (exp->expr[exp->expr_pos[repeat_op_idx]] != '!')) {
      return 0;
    }
    exp_repeat_push(exp,exp_idx_00,repeat_op_idx);
    exp_idx_00 = *exp_idx + 1;
    *exp_idx = exp_idx_00;
  }
  return 0;
}

Assistant:

static int
reparse_equality_expr(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_eq_exp, prev_rel_exp;

    goto reparse_additive_expr;

    /* ('=' / '!=' RelationalExpr)* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_COMP, 0)
            && ((exp->expr[exp->expr_pos[*exp_idx]] == '=') || (exp->expr[exp->expr_pos[*exp_idx]] == '!'))) {
        exp_repeat_push(exp, prev_eq_exp, *exp_idx);
        ++(*exp_idx);

reparse_additive_expr:
        prev_eq_exp = *exp_idx;
        prev_rel_exp = *exp_idx;

        /* AdditiveExpr */
        if (reparse_additive_expr(exp, exp_idx)) {
            return -1;
        }

        /* ('<' / '>' / '<=' / '>=' AdditiveExpr)* */
        while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_COMP, 0)
                && ((exp->expr[exp->expr_pos[*exp_idx]] == '<') || (exp->expr[exp->expr_pos[*exp_idx]] == '>'))) {
            exp_repeat_push(exp, prev_rel_exp, *exp_idx);
            ++(*exp_idx);

            prev_rel_exp = *exp_idx;
            if (reparse_additive_expr(exp, exp_idx)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}